

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

int Gia_ManResubPerform_rec(Gia_ResbMan_t *p,int nLimit)

{
  Vec_Int_t **vUnateLits;
  Vec_Int_t **vUnateLitsW;
  Vec_Int_t **vUnatePairs;
  Vec_Int_t **vUnateLitsW_00;
  word **pSets;
  int iVar1;
  uint uVar2;
  int iVar3;
  word *pIn2;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  
  iVar15 = p->vDivs->nSize;
  if (p->fVerbose != 0) {
    lVar8 = (long)p->nWords;
    uVar16 = 0;
    uVar17 = 0;
    if (0 < lVar8) {
      lVar11 = 0;
      uVar17 = 0;
      do {
        uVar13 = p->pSets[0][lVar11] - (p->pSets[0][lVar11] >> 1 & 0x5555555555555555);
        uVar13 = (uVar13 >> 2 & 0x3333333333333333) + (uVar13 & 0x3333333333333333);
        uVar13 = (uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f;
        uVar13 = (uVar13 >> 8) + uVar13;
        lVar14 = (uVar13 >> 0x10) + uVar13;
        uVar17 = uVar17 + ((int)((ulong)lVar14 >> 0x20) + (int)lVar14 & 0xffU);
        lVar11 = lVar11 + 1;
      } while (lVar8 != lVar11);
    }
    if (0 < p->nWords) {
      lVar11 = 0;
      uVar16 = 0;
      do {
        uVar13 = p->pSets[1][lVar11] - (p->pSets[1][lVar11] >> 1 & 0x5555555555555555);
        uVar13 = (uVar13 >> 2 & 0x3333333333333333) + (uVar13 & 0x3333333333333333);
        uVar13 = (uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f;
        uVar13 = (uVar13 >> 8) + uVar13;
        lVar14 = (uVar13 >> 0x10) + uVar13;
        uVar16 = (ulong)((int)uVar16 + ((int)((ulong)lVar14 >> 0x20) + (int)lVar14 & 0xffU));
        lVar11 = lVar11 + 1;
      } while (lVar8 != lVar11);
    }
    printf("      ");
    printf("ISF: ");
    printf("0=%5d (%5.2f %%) ",((double)(int)uVar17 * 100.0) / (double)(p->nWords << 6),
           (ulong)uVar17);
    printf("1=%5d (%5.2f %%)  ",((double)(int)uVar16 * 100.0) / (double)(p->nWords << 6),uVar16);
  }
  iVar1 = p->nWords;
  lVar8 = (long)iVar1;
  if (0 < lVar8) {
    pSets = p->pSets;
    lVar11 = 0;
    do {
      if (p->pSets[1][lVar11] != 0) {
        if (iVar1 < 1) {
          return 1;
        }
        lVar11 = 0;
        while ((*pSets)[lVar11] == 0) {
          lVar11 = lVar11 + 1;
          if (lVar8 == lVar11) {
            return 1;
          }
        }
        vUnateLits = p->vUnateLits;
        iVar1 = Gia_ManFindOneUnate(pSets,p->vDivs,iVar1,vUnateLits,p->vNotUnateVars,p->fVerbose);
        if (-1 < iVar1) {
          return iVar1;
        }
        if (nLimit == 0) {
          return -1;
        }
        vUnateLitsW = p->vUnateLitsW;
        Gia_ManSortUnates(pSets,p->vDivs,p->nWords,vUnateLits,vUnateLitsW,p->vSorter);
        uVar17 = Gia_ManFindTwoUnate(pSets,p->vDivs,p->nWords,vUnateLits,vUnateLitsW,p->fVerbose);
        if ((int)uVar17 < 0) {
          Vec_IntTwoFindCommon(p->vNotUnateVars[0],p->vNotUnateVars[1],p->vBinateVars);
          pVVar9 = p->vBinateVars;
          if (p->nDivsMax < pVVar9->nSize) {
            pVVar9->nSize = p->nDivsMax;
          }
          if (p->fVerbose != 0) {
            printf("  B = %3d",(ulong)(uint)pVVar9->nSize);
          }
          if ((p->fUseXor == 0) ||
             (uVar17 = Gia_ManFindXor(pSets,p->vDivs,p->nWords,p->vBinateVars,p->vUnatePairs,
                                      p->fVerbose), (int)uVar17 < 0)) {
            if (nLimit == 1) {
              return -1;
            }
            vUnatePairs = p->vUnatePairs;
            Gia_ManFindUnatePairs(pSets,p->vDivs,p->nWords,p->vBinateVars,vUnatePairs,p->fVerbose);
            vUnateLitsW_00 = p->vUnatePairsW;
            Gia_ManSortPairs(pSets,p->vDivs,p->nWords,vUnatePairs,vUnateLitsW_00,p->vSorter);
            uVar17 = Gia_ManFindDivGate(pSets,p->vDivs,p->nWords,vUnateLits,vUnatePairs,vUnateLitsW,
                                        vUnateLitsW_00,p->pDivA);
            if (-1 < (int)uVar17) {
              iVar1 = p->vGates->nSize;
              uVar6 = uVar17 & 1;
              uVar2 = Vec_IntEntry(p->vUnatePairs[uVar6 ^ 1],uVar17 >> 0x11);
              if (-1 < (int)uVar2) {
                iVar15 = iVar1 / 2 + iVar15;
                pVVar9 = p->vGates;
                Vec_IntPush(pVVar9,uVar2 >> 1 & 0x7fff);
                Vec_IntPush(pVVar9,uVar2 >> 0x10);
                if (iVar15 < 0) goto LAB_00795fd2;
                pVVar9 = p->vGates;
                iVar1 = ((uVar2 ^ uVar17 >> 0x10) & 1) + iVar15 * 2;
                Vec_IntPush(pVVar9,uVar17 >> 1 & 0x7fff);
LAB_00795bb9:
                Vec_IntPush(pVVar9,iVar1);
                return uVar6 + iVar15 * 2 + 2;
              }
LAB_0079606d:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            if (nLimit == 2) {
              return -1;
            }
            uVar17 = Gia_ManFindGateGate(pSets,p->vDivs,p->nWords,vUnatePairs,vUnateLitsW_00,
                                         p->pDivA,p->pDivB);
            if (-1 < (int)uVar17) {
              iVar1 = p->vGates->nSize;
              uVar2 = uVar17 & 1 ^ 1;
              uVar6 = Vec_IntEntry(p->vUnatePairs[uVar2],uVar17 >> 2 & 0x3fff);
              if (((int)uVar6 < 0) ||
                 (uVar2 = Vec_IntEntry(vUnatePairs[uVar2],uVar17 >> 0x11), (int)uVar2 < 0))
              goto LAB_0079606d;
              iVar15 = iVar1 / 2 + iVar15;
              pVVar9 = p->vGates;
              Vec_IntPush(pVVar9,uVar6 >> 1 & 0x7fff);
              Vec_IntPush(pVVar9,uVar6 >> 0x10);
              pVVar9 = p->vGates;
              Vec_IntPush(pVVar9,uVar2 >> 1 & 0x7fff);
              Vec_IntPush(pVVar9,uVar2 >> 0x10);
              if (-1 < iVar15) {
                pVVar9 = p->vGates;
                Vec_IntPush(pVVar9,((uVar6 ^ uVar17 >> 1) & 1) + iVar15 * 2);
                Vec_IntPush(pVVar9,((uVar2 ^ uVar17 >> 0x10) & 1) + iVar15 * 2 + 2);
                return (uVar17 & 1) + iVar15 * 2 + 4;
              }
              goto LAB_00795fd2;
            }
            if (nLimit == 3) {
              return -1;
            }
            if (p->vUnateLits[1]->nSize + p->vUnateLits[0]->nSize + p->vUnatePairs[0]->nSize +
                p->vUnatePairs[1]->nSize == 0) {
              return -1;
            }
            iVar3 = 0;
            iVar1 = (*vUnateLitsW)->nSize;
            iVar4 = 0;
            if (iVar1 != 0) {
              if (iVar1 < 1) goto LAB_0079608c;
              iVar4 = *(*vUnateLitsW)->pArray;
            }
            iVar1 = p->vUnateLitsW[1]->nSize;
            if (iVar1 != 0) {
              if (iVar1 < 1) goto LAB_0079608c;
              iVar3 = *p->vUnateLitsW[1]->pArray;
            }
            iVar5 = 0;
            iVar1 = (*vUnateLitsW_00)->nSize;
            iVar7 = 0;
            if (iVar1 != 0) {
              if (iVar1 < 1) goto LAB_0079608c;
              iVar7 = *(*vUnateLitsW_00)->pArray;
            }
            iVar1 = p->vUnatePairsW[1]->nSize;
            if (iVar1 != 0) {
              if (iVar1 < 1) goto LAB_0079608c;
              iVar5 = *p->vUnatePairsW[1]->pArray;
            }
            iVar1 = iVar3;
            if (iVar3 < iVar4) {
              iVar1 = iVar4;
            }
            iVar10 = iVar5;
            if (iVar5 < iVar7) {
              iVar10 = iVar7;
            }
            iVar12 = iVar10;
            if (iVar10 < iVar1) {
              iVar12 = iVar1;
            }
            if (iVar12 == 0) {
              return -1;
            }
            if (iVar1 <= iVar10 / 2) {
              if (vUnatePairs[iVar7 < iVar5]->nSize < 1) goto LAB_0079608c;
              uVar17 = *vUnatePairs[iVar7 < iVar5]->pArray;
              if ((int)uVar17 < 0) goto LAB_0079606d;
              Gia_ManDeriveDivPair(uVar17,p->vDivs,p->nWords,p->pDivA);
              Abc_TtAndSharp(p->pSets[iVar5 <= iVar7],p->pSets[iVar5 <= iVar7],p->pDivA,p->nWords,
                             ~uVar17 & 1);
              if (p->fVerbose != 0) {
                putchar(10);
              }
              uVar2 = Gia_ManResubPerform_rec(p,nLimit + -2);
              if ((int)uVar2 < 0) {
                return -1;
              }
              pVVar9 = p->vGates;
              iVar1 = pVVar9->nSize;
              Vec_IntPush(pVVar9,uVar17 >> 1 & 0x7fff);
              Vec_IntPush(pVVar9,uVar17 >> 0x10);
              iVar15 = iVar1 / 2 + iVar15;
              if (-1 < iVar15) {
                uVar6 = (uint)(iVar5 <= iVar7);
                pVVar9 = p->vGates;
                iVar1 = (~uVar17 & 1) + iVar15 * 2;
                Vec_IntPush(pVVar9,uVar2 ^ uVar6);
                goto LAB_00795bb9;
              }
              goto LAB_00795fd2;
            }
            if (vUnateLits[iVar4 < iVar3]->nSize < 1) {
LAB_0079608c:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar6 = *vUnateLits[iVar4 < iVar3]->pArray;
            if ((int)uVar6 < 0) goto LAB_0079606d;
            pIn2 = (word *)Vec_PtrEntry(p->vDivs,uVar6 >> 1);
            Abc_TtAndSharp(p->pSets[iVar3 <= iVar4],p->pSets[iVar3 <= iVar4],pIn2,p->nWords,
                           ~uVar6 & 1);
            if (p->fVerbose != 0) {
              putchar(10);
            }
            uVar2 = Gia_ManResubPerform_rec(p,nLimit + -1);
            if ((int)uVar2 < 0) {
              return -1;
            }
            pVVar9 = p->vGates;
            iVar1 = pVVar9->nSize;
            uVar17 = (uint)(iVar3 <= iVar4);
            Vec_IntPush(pVVar9,uVar6 ^ 1);
            Vec_IntPush(pVVar9,uVar2 ^ uVar17);
            iVar15 = iVar1 / 2 + iVar15;
            if (iVar15 < 0) goto LAB_00795fd2;
            goto LAB_007959ce;
          }
          if ((uVar17 & 2) != 0) {
            __assert_fail("!Abc_LitIsCompl(iDiv0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                          ,0x468,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
          }
          if ((uVar17 >> 0x10 & 1) != 0) {
            __assert_fail("!Abc_LitIsCompl(iDiv1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                          ,0x469,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
          }
          uVar6 = uVar17 >> 1 & 0x7fff;
          if (uVar6 <= uVar17 >> 0x10) {
            __assert_fail("iDiv0 > iDiv1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                          ,0x46a,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
          }
          pVVar9 = p->vGates;
          iVar1 = pVVar9->nSize;
          Vec_IntPush(pVVar9,uVar6);
          Vec_IntPush(pVVar9,uVar17 >> 0x10);
        }
        else {
          uVar6 = uVar17 >> 1 & 0x7fff;
          if (uVar17 >> 0x10 <= uVar6) {
            __assert_fail("iDiv0 < iDiv1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                          ,0x456,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
          }
          pVVar9 = p->vGates;
          iVar1 = pVVar9->nSize;
          Vec_IntPush(pVVar9,uVar6);
          Vec_IntPush(pVVar9,uVar17 >> 0x10);
        }
        iVar15 = iVar1 / 2 + iVar15;
        if (iVar15 < 0) {
LAB_00795fd2:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar17 = uVar17 & 1;
LAB_007959ce:
        return uVar17 + iVar15 * 2;
      }
      lVar11 = lVar11 + 1;
    } while (lVar8 != lVar11);
  }
  return 0;
}

Assistant:

int Gia_ManResubPerform_rec( Gia_ResbMan_t * p, int nLimit )
{
    int TopOneW[2] = {0}, TopTwoW[2] = {0}, Max1, Max2, iResLit, nVars = Vec_PtrSize(p->vDivs);
    if ( p->fVerbose )
    {
        int nMints[2] = { Abc_TtCountOnesVec(p->pSets[0], p->nWords), Abc_TtCountOnesVec(p->pSets[1], p->nWords) };
        printf( "      " ); 
        printf( "ISF: " ); 
        printf( "0=%5d (%5.2f %%) ",  nMints[0], 100.0*nMints[0]/(64*p->nWords) );
        printf( "1=%5d (%5.2f %%)  ", nMints[1], 100.0*nMints[1]/(64*p->nWords) );
    }
    if ( Abc_TtIsConst0( p->pSets[1], p->nWords ) )
        return 0;
    if ( Abc_TtIsConst0( p->pSets[0], p->nWords ) )
        return 1;
    iResLit = Gia_ManFindOneUnate( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vNotUnateVars, p->fVerbose );
    if ( iResLit >= 0 ) // buffer
        return iResLit;
    if ( nLimit == 0 )
        return -1;
    Gia_ManSortUnates( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vUnateLitsW, p->vSorter );
    iResLit = Gia_ManFindTwoUnate( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vUnateLitsW, p->fVerbose );
    if ( iResLit >= 0 ) // and
    {
        int iNode = nVars + Vec_IntSize(p->vGates)/2;
        int fComp = Abc_LitIsCompl(iResLit);
        int iDiv0 = Abc_Lit2Var(iResLit) & 0x7FFF;
        int iDiv1 = Abc_Lit2Var(iResLit) >> 15;
        assert( iDiv0 < iDiv1 );
        Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
        return Abc_Var2Lit( iNode, fComp );
    }
    Vec_IntTwoFindCommon( p->vNotUnateVars[0], p->vNotUnateVars[1], p->vBinateVars );
    if ( Vec_IntSize(p->vBinateVars) > p->nDivsMax )
        Vec_IntShrink( p->vBinateVars, p->nDivsMax );
    if ( p->fVerbose ) printf( "  B = %3d", Vec_IntSize(p->vBinateVars) );
    //Gia_ManSortBinate( p->pSets, p->vDivs, p->nWords, p->vBinateVars, p->vSorter );
    if ( p->fUseXor )
    {
        iResLit = Gia_ManFindXor( p->pSets, p->vDivs, p->nWords, p->vBinateVars, p->vUnatePairs, p->fVerbose );
        if ( iResLit >= 0 ) // xor
        {
            int iNode = nVars + Vec_IntSize(p->vGates)/2;
            int fComp = Abc_LitIsCompl(iResLit);
            int iDiv0 = Abc_Lit2Var(iResLit) & 0x7FFF;
            int iDiv1 = Abc_Lit2Var(iResLit) >> 15;
            assert( !Abc_LitIsCompl(iDiv0) );
            assert( !Abc_LitIsCompl(iDiv1) );
            assert( iDiv0 > iDiv1 );
            Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
            return Abc_Var2Lit( iNode, fComp );
        }
    }
    if ( nLimit == 1 )
        return -1;
    Gia_ManFindUnatePairs( p->pSets, p->vDivs, p->nWords, p->vBinateVars, p->vUnatePairs, p->fVerbose );
    Gia_ManSortPairs( p->pSets, p->vDivs, p->nWords, p->vUnatePairs, p->vUnatePairsW, p->vSorter );
    iResLit = Gia_ManFindDivGate( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vUnatePairs, p->vUnateLitsW, p->vUnatePairsW, p->pDivA );
    if ( iResLit >= 0 ) // and(div,pair)
    {
        int iNode  = nVars + Vec_IntSize(p->vGates)/2;

        int fComp  = Abc_LitIsCompl(iResLit);
        int iDiv0  = Abc_Lit2Var(iResLit) & 0x7FFF; // div
        int iDiv1  = Abc_Lit2Var(iResLit) >> 15;    // pair

        int Div1   = Vec_IntEntry( p->vUnatePairs[!fComp], Abc_Lit2Var(iDiv1) );
        int fComp1 = Abc_LitIsCompl(Div1) ^ Abc_LitIsCompl(iDiv1);
        int iDiv10 = Abc_Lit2Var(Div1) & 0x7FFF;
        int iDiv11 = Abc_Lit2Var(Div1) >> 15;   

        Vec_IntPushTwo( p->vGates, iDiv10, iDiv11 );
        Vec_IntPushTwo( p->vGates, iDiv0, Abc_Var2Lit(iNode, fComp1) );
        return Abc_Var2Lit( iNode+1, fComp );
    }
    if ( nLimit == 2 )
        return -1;
    iResLit = Gia_ManFindGateGate( p->pSets, p->vDivs, p->nWords, p->vUnatePairs, p->vUnatePairsW, p->pDivA, p->pDivB );
    if ( iResLit >= 0 ) // and(pair,pair)
    {
        int iNode  = nVars + Vec_IntSize(p->vGates)/2;

        int fComp  = Abc_LitIsCompl(iResLit);
        int iDiv0  = Abc_Lit2Var(iResLit) & 0x7FFF; // pair
        int iDiv1  = Abc_Lit2Var(iResLit) >> 15;    // pair

        int Div0   = Vec_IntEntry( p->vUnatePairs[!fComp], Abc_Lit2Var(iDiv0) );
        int fComp0 = Abc_LitIsCompl(Div0) ^ Abc_LitIsCompl(iDiv0);
        int iDiv00 = Abc_Lit2Var(Div0) & 0x7FFF;
        int iDiv01 = Abc_Lit2Var(Div0) >> 15;   
        
        int Div1   = Vec_IntEntry( p->vUnatePairs[!fComp], Abc_Lit2Var(iDiv1) );
        int fComp1 = Abc_LitIsCompl(Div1) ^ Abc_LitIsCompl(iDiv1);
        int iDiv10 = Abc_Lit2Var(Div1) & 0x7FFF;
        int iDiv11 = Abc_Lit2Var(Div1) >> 15;   
        
        Vec_IntPushTwo( p->vGates, iDiv00, iDiv01 );
        Vec_IntPushTwo( p->vGates, iDiv10, iDiv11 );
        Vec_IntPushTwo( p->vGates, Abc_Var2Lit(iNode, fComp0), Abc_Var2Lit(iNode+1, fComp1) );
        return Abc_Var2Lit( iNode+2, fComp );
    }
    if ( nLimit == 3 )
        return -1;
    if ( Vec_IntSize(p->vUnateLits[0]) + Vec_IntSize(p->vUnateLits[1]) + Vec_IntSize(p->vUnatePairs[0]) + Vec_IntSize(p->vUnatePairs[1]) == 0 )
        return -1;

    TopOneW[0] = Vec_IntSize(p->vUnateLitsW[0]) ? Vec_IntEntry(p->vUnateLitsW[0], 0) : 0;
    TopOneW[1] = Vec_IntSize(p->vUnateLitsW[1]) ? Vec_IntEntry(p->vUnateLitsW[1], 0) : 0;

    TopTwoW[0] = Vec_IntSize(p->vUnatePairsW[0]) ? Vec_IntEntry(p->vUnatePairsW[0], 0) : 0;
    TopTwoW[1] = Vec_IntSize(p->vUnatePairsW[1]) ? Vec_IntEntry(p->vUnatePairsW[1], 0) : 0;

    Max1 = Abc_MaxInt(TopOneW[0], TopOneW[1]);
    Max2 = Abc_MaxInt(TopTwoW[0], TopTwoW[1]);
    if ( Abc_MaxInt(Max1, Max2) == 0 )
        return -1;
    if ( Max1 > Max2/2 )
    {
        if ( Max1 == TopOneW[0] || Max1 == TopOneW[1] )
        {
            int fUseOr  = Max1 == TopOneW[0];
            int iDiv    = Vec_IntEntry( p->vUnateLits[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            word * pDiv = (word *)Vec_PtrEntry( p->vDivs, Abc_Lit2Var(iDiv) );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], pDiv, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n" ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-1 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                Vec_IntPushTwo( p->vGates, Abc_LitNot(iDiv), Abc_LitNotCond(iResLit, fUseOr) );
                return Abc_Var2Lit( iNode, fUseOr );
            }
        }
        if ( Max2 == 0 )
            return -1;
/*
        if ( Max2 == TopTwoW[0] || Max2 == TopTwoW[1] )
        {
            int fUseOr  = Max2 == TopTwoW[0];
            int iDiv    = Vec_IntEntry( p->vUnatePairs[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            Gia_ManDeriveDivPair( iDiv, p->vDivs, p->nWords, p->pDivA );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], p->pDivA, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n      " ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-2 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                int iDiv0 = Abc_Lit2Var(iDiv) & 0x7FFF;   
                int iDiv1 = Abc_Lit2Var(iDiv) >> 15;      
                Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
                Vec_IntPushTwo( p->vGates, Abc_LitNotCond(iResLit, fUseOr), Abc_Var2Lit(iNode, !fComp) );
                return Abc_Var2Lit( iNode+1, fUseOr );
            }
        }
*/
    }
    else
    {
        if ( Max2 == TopTwoW[0] || Max2 == TopTwoW[1] )
        {
            int fUseOr  = Max2 == TopTwoW[0];
            int iDiv    = Vec_IntEntry( p->vUnatePairs[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            Gia_ManDeriveDivPair( iDiv, p->vDivs, p->nWords, p->pDivA );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], p->pDivA, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n" ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-2 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                int iDiv0 = Abc_Lit2Var(iDiv) & 0x7FFF;   
                int iDiv1 = Abc_Lit2Var(iDiv) >> 15;      
                Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
                Vec_IntPushTwo( p->vGates, Abc_LitNotCond(iResLit, fUseOr), Abc_Var2Lit(iNode, !fComp) );
                return Abc_Var2Lit( iNode+1, fUseOr );
            }
        }
        if ( Max1 == 0 )
            return -1;
/*
        if ( Max1 == TopOneW[0] || Max1 == TopOneW[1] )
        {
            int fUseOr  = Max1 == TopOneW[0];
            int iDiv    = Vec_IntEntry( p->vUnateLits[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            word * pDiv = (word *)Vec_PtrEntry( p->vDivs, Abc_Lit2Var(iDiv) );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], pDiv, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n      " ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-1 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                Vec_IntPushTwo( p->vGates, Abc_LitNot(iDiv), Abc_LitNotCond(iResLit, fUseOr) );
                return Abc_Var2Lit( iNode, fUseOr );
            }
        }
*/
    }
    return -1;
}